

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_list_jobs.cc
# Opt level: O2

int __thiscall
aliyun::Emr::ListJobs
          (Emr *this,EmrListJobsRequestType *req,EmrListJobsResponseType *response,
          EmrErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  allocator<char> local_3fc;
  allocator<char> local_3fb;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  Value val;
  undefined1 local_3e0 [8];
  _Alloc_hider local_3d8;
  undefined1 local_3d0 [24];
  Int local_3b8;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  Int local_390;
  EmrListJobsResponseType *local_388;
  string local_380;
  string str_response;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"ListJobs",(allocator<char> *)&local_380);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->is_desc)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"IsDesc",(allocator<char> *)local_3e0);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->page_number)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"PageNumber",(allocator<char> *)local_3e0);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->page_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"PageSize",(allocator<char> *)local_3e0);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"RegionId",(allocator<char> *)local_3e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,this->region_id_,(allocator<char> *)&local_380);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_3e0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e0,anon_var_dwarf_13598b + 9,&local_3f9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_3e0);
        std::__cxx11::string::~string((string *)local_3e0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_3e0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e0,anon_var_dwarf_13598b + 9,&local_3fa);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_3e0);
        std::__cxx11::string::~string((string *)local_3e0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_3e0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e0,anon_var_dwarf_13598b + 9,&local_3fb);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_3e0);
        std::__cxx11::string::~string((string *)local_3e0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_3e0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e0,anon_var_dwarf_13598b + 9,&local_3fc);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_3e0);
        std::__cxx11::string::~string((string *)local_3e0);
      }
      if (response != (EmrListJobsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"TotalCount");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TotalCount");
          IVar3 = Json::Value::asInt(pVVar5);
          response->total_count = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageNumber");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageNumber");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_number = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageSize");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageSize");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_size = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Jobs");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Jobs");
          bVar1 = Json::Value::isMember(pVVar5,"JobInfo");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"Jobs");
            pVVar5 = Json::Value::operator[](pVVar5,"JobInfo");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              local_388 = response;
              for (index = 0; AVar4 = Json::Value::size(pVVar5), index < AVar4; index = index + 1) {
                local_3d8._M_p = local_3d0 + 8;
                local_3d0._0_8_ = 0;
                local_3d0[8] = '\0';
                local_3b0._M_p = (pointer)&local_3a0;
                local_3a8 = 0;
                local_3a0._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"JobId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"JobId");
                  IVar3 = Json::Value::asInt(pVVar7);
                  local_3e0 = (undefined1  [8])(long)IVar3;
                }
                bVar1 = Json::Value::isMember(pVVar6,"JobName");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"JobName");
                  Json::Value::asString_abi_cxx11_(&local_380,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_3d8,(string *)&local_380);
                  response = local_388;
                  std::__cxx11::string::~string((string *)&local_380);
                }
                bVar1 = Json::Value::isMember(pVVar6,"JobType");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"JobType");
                  local_3b8 = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"EnvConfig");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"EnvConfig");
                  Json::Value::asString_abi_cxx11_(&local_380,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_3b0,(string *)&local_380);
                  response = local_388;
                  std::__cxx11::string::~string((string *)&local_380);
                }
                bVar1 = Json::Value::isMember(pVVar6,"JobFailAct");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"JobFailAct");
                  local_390 = Json::Value::asInt(pVVar6);
                }
                std::
                vector<aliyun::EmrListJobsJobInfoType,_std::allocator<aliyun::EmrListJobsJobInfoType>_>
                ::push_back(&response->jobs,(value_type *)local_3e0);
                EmrListJobsJobInfoType::~EmrListJobsJobInfoType((EmrListJobsJobInfoType *)local_3e0)
                ;
              }
            }
          }
        }
      }
      goto LAB_00145fd5;
    }
  }
  iVar2 = -1;
  if (error_info != (EmrErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00145fd5:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Emr::ListJobs(const EmrListJobsRequestType& req,
                      EmrListJobsResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListJobs");
  if(!req.is_desc.empty()) {
    req_rpc->AddRequestQuery("IsDesc", req.is_desc);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}